

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

bool PrepareNonBlankMultiLine(char **p)

{
  int iVar1;
  int iVar2;
  
  while( true ) {
    iVar1 = SkipBlanks(p);
    if ((iVar1 == 0) || ((listmacro != 0 && (lijstp == (CStringsList *)0x0)))) break;
    ListFile(false);
    iVar2 = ReadLine(true);
    if (iVar2 == 0) break;
    PrepareLine();
    *p = lp;
  }
  return iVar1 == 0;
}

Assistant:

bool PrepareNonBlankMultiLine(char*& p) {
	// loop while the current line is blank-only (read further lines until EOF or non-blank char)
	while (SkipBlanks(p)) {
		// if inside macro system, but without any more macro-lines in buffer, act as if "EOF"
		// (to not leak into reading actual file while the macro is executing)
		if (listmacro && nullptr == lijstp) return false;
		// list the current (old) line
		ListFile();
		// read the next line
		if (!ReadLine()) return false;
		PrepareLine();
		p = lp;
	}
	return true;
}